

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10ddcf::TwoValuesWithHashCollision::TwoValuesWithHashCollision
          (TwoValuesWithHashCollision *this)

{
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_29;
  address local_28;
  TwoValuesWithHashCollision *local_10;
  TwoValuesWithHashCollision *this_local;
  
  local_10 = this;
  GenericIndexFixture::GenericIndexFixture(&this->super_GenericIndexFixture);
  (this->super_GenericIndexFixture).super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__TwoValuesWithHashCollision_003d1200;
  hash_function::hash_function
            (&this->hash_,
             (map *)(anonymous_namespace)::TwoValuesWithHashCollision::hashes__abi_cxx11_);
  this_00 = (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)operator_new(0x38);
  local_28.a_ = (value_type)pstore::typed_address<pstore::index::header_block>::null();
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::hamt_map(this_00,&(this->super_GenericIndexFixture).super_IndexFixture.db_,
             (typed_address<pstore::index::header_block>)local_28.a_,&this->hash_,&local_29);
  std::
  unique_ptr<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>,std::default_delete<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>>>
  ::
  unique_ptr<std::default_delete<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>>,void>
            ((unique_ptr<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>,std::default_delete<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>>>
              *)&this->index_,this_00);
  return;
}

Assistant:

TwoValuesWithHashCollision ()
                : hash_{hashes_}
                , index_{new test_trie (
                      db_, pstore::typed_address<pstore::index::header_block>::null (), hash_)} {}